

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int allocateBtreePage(BtShared *pBt,MemPage **ppPage,Pgno *pPgno,Pgno nearby,u8 eMode)

{
  u8 uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  Pgno pgno;
  Bitvec *p;
  bool bVar5;
  bool bVar6;
  MemPage *pMVar7;
  MemPage **ppPage_00;
  MemPage *pMVar8;
  int iVar9;
  uint uVar10;
  byte *pbVar11;
  u8 *puVar12;
  int iVar13;
  ulong uVar14;
  undefined8 uVar15;
  uint uVar16;
  int iVar17;
  undefined7 in_register_00000081;
  bool bVar18;
  BtShared *pBVar19;
  uint uVar20;
  MemPage *pMVar21;
  MemPage *pTrunk;
  u8 eType;
  int local_94;
  MemPage *local_78;
  undefined4 local_6c;
  uint *local_68;
  uint local_60;
  uint local_5c;
  ulong local_58;
  MemPage **local_50;
  MemPage *local_48;
  MemPage *local_40;
  Pgno local_34;
  
  local_78 = (MemPage *)0x0;
  pMVar21 = pBt->pPage1;
  uVar3 = pBt->nPage;
  uVar16 = *(uint *)(pMVar21->aData + 0x24);
  uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
  local_68 = pPgno;
  if (uVar3 <= uVar16) {
    uVar15 = 0xe393;
    goto LAB_001274c5;
  }
  if (uVar16 == 0) {
    uVar1 = pBt->bDoTruncate;
    iVar9 = sqlite3PagerWrite(pMVar21->pDbPage);
    if (iVar9 == 0) {
      uVar3 = pBt->nPage;
      pBt->nPage = uVar3 + 1;
      uVar16 = (uint)sqlite3PendingByte / pBt->pageSize;
      if (uVar3 == uVar16) {
        pBt->nPage = uVar3 + 2;
      }
      uVar3 = (uint)(uVar1 == '\0');
      pBVar19 = pBt;
      if (pBt->autoVacuum == '\0') {
LAB_00127be9:
        iVar13 = (int)pBVar19;
        uVar16 = pBt->nPage;
        *(uint *)(pBt->pPage1->aData + 0x1c) =
             uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
        pgno = pBt->nPage;
        *local_68 = pgno;
        iVar9 = btreeGetPage(pBt,pgno,ppPage,uVar3);
        if (iVar9 != 0) goto LAB_00127c16;
        iVar9 = sqlite3PagerWrite((*ppPage)->pDbPage);
        bVar18 = true;
        if ((iVar9 != 0) && (*ppPage != (MemPage *)0x0)) {
          sqlite3PagerUnrefNotNull((*ppPage)->pDbPage);
        }
      }
      else {
        uVar20 = pBt->nPage;
        uVar10 = 0;
        if (1 < uVar20) {
          iVar9 = (uVar20 - 2) - (uVar20 - 2) % (pBt->usableSize / 5 + 1);
          uVar10 = iVar9 + (uint)(iVar9 + 1U == uVar16) + 2;
        }
        if (uVar10 != uVar20) goto LAB_00127be9;
        local_40 = (MemPage *)0x0;
        uVar16 = btreeGetPage(pBt,uVar20,&local_40,uVar3);
        pMVar21 = local_40;
        pBVar19 = (BtShared *)(ulong)uVar16;
        if (uVar16 == 0) {
          uVar16 = sqlite3PagerWrite(local_40->pDbPage);
          pBVar19 = (BtShared *)(ulong)uVar16;
          if (pMVar21 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(pMVar21->pDbPage);
          }
        }
        iVar9 = (int)pBVar19;
        if (iVar9 == 0) {
          uVar16 = pBt->nPage;
          pBt->nPage = uVar16 + 1;
          if (uVar16 == (uint)sqlite3PendingByte / pBt->pageSize) {
            pBt->nPage = uVar16 + 2;
          }
          goto LAB_00127be9;
        }
        bVar18 = false;
        iVar13 = iVar9;
      }
    }
    else {
LAB_00127c16:
      bVar18 = false;
      iVar13 = iVar9;
    }
    if (!bVar18) {
      return iVar13;
    }
    pMVar21 = (MemPage *)0x0;
  }
  else {
    local_50 = ppPage;
    local_34 = nearby;
    if (eMode == '\x02') {
      bVar18 = true;
LAB_001275c5:
      iVar9 = sqlite3PagerWrite(pMVar21->pDbPage);
      if (iVar9 != 0) goto LAB_001275dd;
      uVar16 = uVar16 - 1;
      *(uint *)(pMVar21->aData + 0x24) =
           uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 * 0x1000000;
      local_6c = (int)CONCAT71(in_register_00000081,eMode);
      local_48 = pMVar21;
      do {
        pMVar21 = local_78;
        if (local_78 == (MemPage *)0x0) {
          puVar12 = local_48->aData;
          uVar16 = (uint)puVar12[0x22] << 8 |
                   (uint)puVar12[0x21] << 0x10 | (uint)puVar12[0x20] << 0x18;
          pbVar11 = puVar12 + 0x23;
        }
        else {
          pbVar11 = local_78->aData;
          uVar16 = (uint)pbVar11[2] << 8 | (uint)pbVar11[1] << 0x10 | (uint)*pbVar11 << 0x18;
          pbVar11 = pbVar11 + 3;
        }
        uVar16 = *pbVar11 | uVar16;
        if (uVar3 < uVar16) {
          iVar9 = 0xb;
          sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xe3ca,
                      "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
        }
        else {
          iVar9 = btreeGetPage(pBt,uVar16,&local_78,0);
        }
        pMVar7 = local_78;
        if (iVar9 != 0) {
          local_78 = (MemPage *)0x0;
          goto LAB_00127ca4;
        }
        puVar12 = local_78->aData;
        uVar20 = *(uint *)(puVar12 + 4);
        uVar20 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18
        ;
        if ((bVar18) || (uVar20 != 0)) {
          if ((pBt->usableSize >> 2) - 2 < uVar20) {
            iVar9 = 0xb;
            sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xe3e7,
                        "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
LAB_00127d69:
            bVar18 = false;
            goto LAB_00127ca9;
          }
          if (bVar18) {
            if ((uVar16 == local_34) || ((char)local_6c == '\x02' && uVar16 < local_34)) {
              *local_68 = uVar16;
              *local_50 = local_78;
              iVar9 = sqlite3PagerWrite(local_78->pDbPage);
              bVar18 = false;
              if (iVar9 != 0) goto LAB_00127d69;
              if (uVar20 == 0) {
                if (pMVar21 == (MemPage *)0x0) {
                  puVar12 = local_48->aData + 0x20;
                }
                else {
                  iVar9 = sqlite3PagerWrite(pMVar21->pDbPage);
                  if (iVar9 != 0) goto LAB_00127ca9;
                  puVar12 = pMVar21->aData;
                }
                *(undefined4 *)puVar12 = *(undefined4 *)pMVar7->aData;
                iVar9 = 0;
              }
              else {
                puVar12 = pMVar7->aData;
                bVar2 = puVar12[0xb];
                uVar16 = (uint)puVar12[10] << 8 |
                         (uint)puVar12[9] << 0x10 | (uint)puVar12[8] << 0x18 | (uint)bVar2;
                if (uVar3 < uVar16) {
                  iVar9 = 0xb;
                  sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xe409,
                              "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
LAB_001278f7:
                  bVar5 = false;
                }
                else {
                  local_58 = CONCAT44(local_58._4_4_,(uint)puVar12[8]);
                  local_60 = (uint)puVar12[10];
                  local_5c = (uint)puVar12[9];
                  iVar9 = btreeGetPage(pBt,uVar16,&local_40,0);
                  pMVar8 = local_40;
                  if (iVar9 != 0) goto LAB_001278f7;
                  iVar9 = sqlite3PagerWrite(local_40->pDbPage);
                  if (iVar9 != 0) {
                    if (pMVar8 != (MemPage *)0x0) {
                      sqlite3PagerUnrefNotNull(pMVar8->pDbPage);
                    }
                    goto LAB_001278f7;
                  }
                  *(undefined4 *)pMVar8->aData = *(undefined4 *)pMVar7->aData;
                  uVar16 = uVar20 - 1;
                  *(uint *)(pMVar8->aData + 4) =
                       uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                       uVar16 * 0x1000000;
                  memcpy(pMVar8->aData + 8,pMVar7->aData + 0xc,(ulong)(uVar20 * 4 - 4));
                  if (pMVar8 != (MemPage *)0x0) {
                    sqlite3PagerUnrefNotNull(pMVar8->pDbPage);
                  }
                  if (pMVar21 == (MemPage *)0x0) {
                    puVar12 = local_48->aData;
                    puVar12[0x20] = (u8)local_58;
                    puVar12[0x21] = (u8)local_5c;
                    puVar12[0x22] = (u8)local_60;
                    puVar12[0x23] = bVar2;
                    bVar5 = true;
                    iVar9 = 0;
                  }
                  else {
                    iVar13 = sqlite3PagerWrite(pMVar21->pDbPage);
                    iVar9 = 0;
                    if (iVar13 == 0) {
                      puVar12 = pMVar21->aData;
                      *puVar12 = (u8)local_58;
                      puVar12[1] = (u8)local_5c;
                      puVar12[2] = (u8)local_60;
                      puVar12[3] = bVar2;
                      bVar5 = true;
                    }
                    else {
                      bVar5 = false;
                      iVar9 = iVar13;
                    }
                  }
                }
                bVar18 = false;
                if (!bVar5) goto LAB_00127ca9;
              }
              local_78 = (MemPage *)0x0;
              bVar5 = false;
              goto LAB_001279cb;
            }
          }
          if (uVar20 == 0) {
            iVar9 = 0;
            bVar5 = bVar18;
          }
          else {
            uVar16 = 0;
            if (local_34 != 0) {
              if ((char)local_6c == '\x02') {
                uVar10 = 8;
                uVar14 = 0;
                do {
                  uVar4 = *(uint *)(puVar12 + uVar10);
                  if ((uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                      uVar4 << 0x18) <= local_34) {
                    uVar16 = (uint)uVar14;
                    break;
                  }
                  uVar14 = uVar14 + 1;
                  uVar10 = uVar10 + 4;
                } while (uVar20 != uVar14);
              }
              else {
                uVar16 = 0;
                if (uVar20 != 1) {
                  uVar16 = *(uint *)(puVar12 + 8);
                  iVar13 = (uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                           uVar16 << 0x18) - local_34;
                  iVar9 = -iVar13;
                  if (-1 < iVar13) {
                    iVar9 = iVar13;
                  }
                  uVar16 = 0;
                  uVar14 = 1;
                  uVar10 = 0xc;
                  do {
                    uVar4 = *(uint *)(puVar12 + uVar10);
                    iVar17 = (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                             uVar4 << 0x18) - local_34;
                    iVar13 = -iVar17;
                    if (-1 < iVar17) {
                      iVar13 = iVar17;
                    }
                    if (iVar13 < iVar9) {
                      uVar16 = (uint)uVar14;
                      iVar9 = iVar13;
                    }
                    uVar14 = uVar14 + 1;
                    uVar10 = uVar10 + 4;
                  } while (uVar20 != uVar14);
                }
              }
            }
            uVar14 = (ulong)(uVar16 * 4 + 8);
            uVar10 = *(uint *)(puVar12 + uVar14);
            uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                     uVar10 << 0x18;
            if (uVar3 < uVar10) {
              iVar9 = 0xb;
              sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xe44a,
                          "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
LAB_0012799a:
              bVar6 = false;
            }
            else {
              if (((uVar10 == local_34) || ((char)local_6c == '\x02' && uVar10 < local_34)) ||
                 (!bVar18)) {
                *local_68 = uVar10;
                local_58 = uVar14;
                iVar9 = sqlite3PagerWrite(local_78->pDbPage);
                ppPage_00 = local_50;
                if (iVar9 != 0) goto LAB_0012799a;
                uVar10 = uVar20 - 1;
                if (uVar16 < uVar10) {
                  *(undefined4 *)(puVar12 + local_58) = *(undefined4 *)(puVar12 + (uVar20 * 4 + 4));
                }
                *(uint *)(puVar12 + 4) =
                     uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                     uVar10 * 0x1000000;
                uVar16 = *local_68;
                p = pBt->pHasContent;
                if (p == (Bitvec *)0x0) {
                  uVar20 = 1;
                }
                else {
                  uVar20 = 0;
                  if (uVar16 <= p->iSize) {
                    iVar9 = sqlite3BitvecTest(p,uVar16);
                    uVar20 = (uint)(iVar9 == 0);
                  }
                }
                iVar9 = btreeGetPage(pBt,uVar16,ppPage_00,uVar20);
                if (iVar9 == 0) {
                  iVar9 = sqlite3PagerWrite((*ppPage_00)->pDbPage);
                  if (iVar9 == 0) {
                    bVar18 = false;
                    iVar9 = 0;
                  }
                  else {
                    if (*ppPage_00 != (MemPage *)0x0) {
                      sqlite3PagerUnrefNotNull((*ppPage_00)->pDbPage);
                    }
                    bVar18 = false;
                  }
                }
                else {
                  bVar18 = false;
                }
              }
              else {
                bVar18 = true;
                iVar9 = 0;
              }
              bVar6 = true;
            }
            bVar5 = bVar18;
            if (!bVar6) goto LAB_00127ca4;
          }
        }
        else {
          iVar9 = sqlite3PagerWrite(local_78->pDbPage);
          if (iVar9 != 0) goto LAB_00127ca4;
          *local_68 = uVar16;
          *(undefined4 *)(local_48->aData + 0x20) = *(undefined4 *)pMVar7->aData;
          *local_50 = pMVar7;
          local_78 = (MemPage *)0x0;
          iVar9 = 0;
          bVar5 = false;
        }
LAB_001279cb:
        if (pMVar21 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(pMVar21->pDbPage);
        }
        bVar18 = true;
      } while (bVar5);
      pMVar21 = (MemPage *)0x0;
LAB_00127ca4:
      bVar18 = false;
    }
    else {
      if ((eMode != '\x01') || (uVar3 < nearby)) {
        bVar18 = false;
        goto LAB_001275c5;
      }
      iVar9 = ptrmapGet(pBt,nearby,(u8 *)&local_40,(Pgno *)0x0);
      if (iVar9 == 0) {
        bVar18 = iVar9 == 0 && (char)local_40 == '\x02';
        local_94 = iVar9;
        goto LAB_001275c5;
      }
LAB_001275dd:
      pMVar21 = (MemPage *)0x0;
      bVar18 = true;
      local_94 = iVar9;
    }
LAB_00127ca9:
    ppPage = local_50;
    if (bVar18) {
      return local_94;
    }
  }
  if (local_78 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(local_78->pDbPage);
  }
  if (pMVar21 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(pMVar21->pDbPage);
  }
  if (iVar9 != 0) {
    *ppPage = (MemPage *)0x0;
    return iVar9;
  }
  pMVar21 = *ppPage;
  if (pMVar21->pDbPage->nRef < 2) {
    pMVar21->isInit = '\0';
    return 0;
  }
  if (pMVar21 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(pMVar21->pDbPage);
  }
  *ppPage = (MemPage *)0x0;
  uVar15 = 0xe4ad;
LAB_001274c5:
  sqlite3_log(0xb,"database corruption at line %d of [%.10s]",uVar15,
              "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
  return 0xb;
}

Assistant:

static int allocateBtreePage(
  BtShared *pBt,         /* The btree */
  MemPage **ppPage,      /* Store pointer to the allocated page here */
  Pgno *pPgno,           /* Store the page number here */
  Pgno nearby,           /* Search for a page near this one */
  u8 eMode               /* BTALLOC_EXACT, BTALLOC_LT, or BTALLOC_ANY */
){
  MemPage *pPage1;
  int rc;
  u32 n;     /* Number of pages on the freelist */
  u32 k;     /* Number of leaves on the trunk of the freelist */
  MemPage *pTrunk = 0;
  MemPage *pPrevTrunk = 0;
  Pgno mxPage;     /* Total size of the database file */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( eMode==BTALLOC_ANY || (nearby>0 && IfNotOmitAV(pBt->autoVacuum)) );
  pPage1 = pBt->pPage1;
  mxPage = btreePagecount(pBt);
  /* EVIDENCE-OF: R-05119-02637 The 4-byte big-endian integer at offset 36
  ** stores stores the total number of pages on the freelist. */
  n = get4byte(&pPage1->aData[36]);
  testcase( n==mxPage-1 );
  if( n>=mxPage ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( n>0 ){
    /* There are pages on the freelist.  Reuse one of those pages. */
    Pgno iTrunk;
    u8 searchList = 0; /* If the free-list must be searched for 'nearby' */
    
    /* If eMode==BTALLOC_EXACT and a query of the pointer-map
    ** shows that the page 'nearby' is somewhere on the free-list, then
    ** the entire-list will be searched for that page.
    */
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( eMode==BTALLOC_EXACT ){
      if( nearby<=mxPage ){
        u8 eType;
        assert( nearby>0 );
        assert( pBt->autoVacuum );
        rc = ptrmapGet(pBt, nearby, &eType, 0);
        if( rc ) return rc;
        if( eType==PTRMAP_FREEPAGE ){
          searchList = 1;
        }
      }
    }else if( eMode==BTALLOC_LE ){
      searchList = 1;
    }
#endif

    /* Decrement the free-list count by 1. Set iTrunk to the index of the
    ** first free-list trunk page. iPrevTrunk is initially 1.
    */
    rc = sqlite3PagerWrite(pPage1->pDbPage);
    if( rc ) return rc;
    put4byte(&pPage1->aData[36], n-1);

    /* The code within this loop is run only once if the 'searchList' variable
    ** is not true. Otherwise, it runs once for each trunk-page on the
    ** free-list until the page 'nearby' is located (eMode==BTALLOC_EXACT)
    ** or until a page less than 'nearby' is located (eMode==BTALLOC_LT)
    */
    do {
      pPrevTrunk = pTrunk;
      if( pPrevTrunk ){
        /* EVIDENCE-OF: R-01506-11053 The first integer on a freelist trunk page
        ** is the page number of the next freelist trunk page in the list or
        ** zero if this is the last freelist trunk page. */
        iTrunk = get4byte(&pPrevTrunk->aData[0]);
      }else{
        /* EVIDENCE-OF: R-59841-13798 The 4-byte big-endian integer at offset 32
        ** stores the page number of the first page of the freelist, or zero if
        ** the freelist is empty. */
        iTrunk = get4byte(&pPage1->aData[32]);
      }
      testcase( iTrunk==mxPage );
      if( iTrunk>mxPage ){
        rc = SQLITE_CORRUPT_BKPT;
      }else{
        rc = btreeGetPage(pBt, iTrunk, &pTrunk, 0);
      }
      if( rc ){
        pTrunk = 0;
        goto end_allocate_page;
      }
      assert( pTrunk!=0 );
      assert( pTrunk->aData!=0 );
      /* EVIDENCE-OF: R-13523-04394 The second integer on a freelist trunk page
      ** is the number of leaf page pointers to follow. */
      k = get4byte(&pTrunk->aData[4]);
      if( k==0 && !searchList ){
        /* The trunk has no leaves and the list is not being searched. 
        ** So extract the trunk page itself and use it as the newly 
        ** allocated page */
        assert( pPrevTrunk==0 );
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        *pPgno = iTrunk;
        memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
        *ppPage = pTrunk;
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
      }else if( k>(u32)(pBt->usableSize/4 - 2) ){
        /* Value of k is out of range.  Database corruption */
        rc = SQLITE_CORRUPT_BKPT;
        goto end_allocate_page;
#ifndef SQLITE_OMIT_AUTOVACUUM
      }else if( searchList 
            && (nearby==iTrunk || (iTrunk<nearby && eMode==BTALLOC_LE)) 
      ){
        /* The list is being searched and this trunk page is the page
        ** to allocate, regardless of whether it has leaves.
        */
        *pPgno = iTrunk;
        *ppPage = pTrunk;
        searchList = 0;
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        if( k==0 ){
          if( !pPrevTrunk ){
            memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc!=SQLITE_OK ){
              goto end_allocate_page;
            }
            memcpy(&pPrevTrunk->aData[0], &pTrunk->aData[0], 4);
          }
        }else{
          /* The trunk page is required by the caller but it contains 
          ** pointers to free-list leaves. The first leaf becomes a trunk
          ** page in this case.
          */
          MemPage *pNewTrunk;
          Pgno iNewTrunk = get4byte(&pTrunk->aData[8]);
          if( iNewTrunk>mxPage ){ 
            rc = SQLITE_CORRUPT_BKPT;
            goto end_allocate_page;
          }
          testcase( iNewTrunk==mxPage );
          rc = btreeGetPage(pBt, iNewTrunk, &pNewTrunk, 0);
          if( rc!=SQLITE_OK ){
            goto end_allocate_page;
          }
          rc = sqlite3PagerWrite(pNewTrunk->pDbPage);
          if( rc!=SQLITE_OK ){
            releasePage(pNewTrunk);
            goto end_allocate_page;
          }
          memcpy(&pNewTrunk->aData[0], &pTrunk->aData[0], 4);
          put4byte(&pNewTrunk->aData[4], k-1);
          memcpy(&pNewTrunk->aData[8], &pTrunk->aData[12], (k-1)*4);
          releasePage(pNewTrunk);
          if( !pPrevTrunk ){
            assert( sqlite3PagerIswriteable(pPage1->pDbPage) );
            put4byte(&pPage1->aData[32], iNewTrunk);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc ){
              goto end_allocate_page;
            }
            put4byte(&pPrevTrunk->aData[0], iNewTrunk);
          }
        }
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
#endif
      }else if( k>0 ){
        /* Extract a leaf from the trunk */
        u32 closest;
        Pgno iPage;
        unsigned char *aData = pTrunk->aData;
        if( nearby>0 ){
          u32 i;
          closest = 0;
          if( eMode==BTALLOC_LE ){
            for(i=0; i<k; i++){
              iPage = get4byte(&aData[8+i*4]);
              if( iPage<=nearby ){
                closest = i;
                break;
              }
            }
          }else{
            int dist;
            dist = sqlite3AbsInt32(get4byte(&aData[8]) - nearby);
            for(i=1; i<k; i++){
              int d2 = sqlite3AbsInt32(get4byte(&aData[8+i*4]) - nearby);
              if( d2<dist ){
                closest = i;
                dist = d2;
              }
            }
          }
        }else{
          closest = 0;
        }

        iPage = get4byte(&aData[8+closest*4]);
        testcase( iPage==mxPage );
        if( iPage>mxPage ){
          rc = SQLITE_CORRUPT_BKPT;
          goto end_allocate_page;
        }
        testcase( iPage==mxPage );
        if( !searchList 
         || (iPage==nearby || (iPage<nearby && eMode==BTALLOC_LE)) 
        ){
          int noContent;
          *pPgno = iPage;
          TRACE(("ALLOCATE: %d was leaf %d of %d on trunk %d"
                 ": %d more free pages\n",
                 *pPgno, closest+1, k, pTrunk->pgno, n-1));
          rc = sqlite3PagerWrite(pTrunk->pDbPage);
          if( rc ) goto end_allocate_page;
          if( closest<k-1 ){
            memcpy(&aData[8+closest*4], &aData[4+k*4], 4);
          }
          put4byte(&aData[4], k-1);
          noContent = !btreeGetHasContent(pBt, *pPgno)? PAGER_GET_NOCONTENT : 0;
          rc = btreeGetPage(pBt, *pPgno, ppPage, noContent);
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerWrite((*ppPage)->pDbPage);
            if( rc!=SQLITE_OK ){
              releasePage(*ppPage);
            }
          }
          searchList = 0;
        }
      }
      releasePage(pPrevTrunk);
      pPrevTrunk = 0;
    }while( searchList );
  }else{
    /* There are no pages on the freelist, so append a new page to the
    ** database image.
    **
    ** Normally, new pages allocated by this block can be requested from the
    ** pager layer with the 'no-content' flag set. This prevents the pager
    ** from trying to read the pages content from disk. However, if the
    ** current transaction has already run one or more incremental-vacuum
    ** steps, then the page we are about to allocate may contain content
    ** that is required in the event of a rollback. In this case, do
    ** not set the no-content flag. This causes the pager to load and journal
    ** the current page content before overwriting it.
    **
    ** Note that the pager will not actually attempt to load or journal 
    ** content for any page that really does lie past the end of the database
    ** file on disk. So the effects of disabling the no-content optimization
    ** here are confined to those pages that lie between the end of the
    ** database image and the end of the database file.
    */
    int bNoContent = (0==IfNotOmitAV(pBt->bDoTruncate))? PAGER_GET_NOCONTENT:0;

    rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
    if( rc ) return rc;
    pBt->nPage++;
    if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ) pBt->nPage++;

#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum && PTRMAP_ISPAGE(pBt, pBt->nPage) ){
      /* If *pPgno refers to a pointer-map page, allocate two new pages
      ** at the end of the file instead of one. The first allocated page
      ** becomes a new pointer-map page, the second is used by the caller.
      */
      MemPage *pPg = 0;
      TRACE(("ALLOCATE: %d from end of file (pointer-map page)\n", pBt->nPage));
      assert( pBt->nPage!=PENDING_BYTE_PAGE(pBt) );
      rc = btreeGetPage(pBt, pBt->nPage, &pPg, bNoContent);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pPg->pDbPage);
        releasePage(pPg);
      }
      if( rc ) return rc;
      pBt->nPage++;
      if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ){ pBt->nPage++; }
    }
#endif
    put4byte(28 + (u8*)pBt->pPage1->aData, pBt->nPage);
    *pPgno = pBt->nPage;

    assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );
    rc = btreeGetPage(pBt, *pPgno, ppPage, bNoContent);
    if( rc ) return rc;
    rc = sqlite3PagerWrite((*ppPage)->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(*ppPage);
    }
    TRACE(("ALLOCATE: %d from end of file\n", *pPgno));
  }

  assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );

end_allocate_page:
  releasePage(pTrunk);
  releasePage(pPrevTrunk);
  if( rc==SQLITE_OK ){
    if( sqlite3PagerPageRefcount((*ppPage)->pDbPage)>1 ){
      releasePage(*ppPage);
      *ppPage = 0;
      return SQLITE_CORRUPT_BKPT;
    }
    (*ppPage)->isInit = 0;
  }else{
    *ppPage = 0;
  }
  assert( rc!=SQLITE_OK || sqlite3PagerIswriteable((*ppPage)->pDbPage) );
  return rc;
}